

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
::nosize_unchecked_emplace_at<std::__cxx11::string>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  ulong uVar3;
  group_type_pointer pgVar4;
  uint uVar5;
  ushort uVar6;
  byte bVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 auVar9 [16];
  
  uVar3 = arrays_->groups_size_mask;
  pgVar4 = arrays_->groups_;
  lVar8 = 1;
  while( true ) {
    pgVar1 = pgVar4 + pos0;
    pgVar2 = pgVar4 + pos0;
    bVar7 = pgVar2->m[0xf].n;
    auVar9[0] = -(pgVar2->m[0].n == '\0');
    auVar9[1] = -(pgVar2->m[1].n == '\0');
    auVar9[2] = -(pgVar2->m[2].n == '\0');
    auVar9[3] = -(pgVar2->m[3].n == '\0');
    auVar9[4] = -(pgVar2->m[4].n == '\0');
    auVar9[5] = -(pgVar2->m[5].n == '\0');
    auVar9[6] = -(pgVar2->m[6].n == '\0');
    auVar9[7] = -(pgVar2->m[7].n == '\0');
    auVar9[8] = -(pgVar2->m[8].n == '\0');
    auVar9[9] = -(pgVar2->m[9].n == '\0');
    auVar9[10] = -(pgVar2->m[10].n == '\0');
    auVar9[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar9[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar9[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar9[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar9[0xf] = -(bVar7 == 0);
    uVar6 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe;
    if (uVar6 != 0) break;
    pgVar1->m[0xf].n = bVar7 | '\x01' << ((byte)hash & 7);
    pos0 = pos0 + lVar8 & uVar3;
    lVar8 = lVar8 + 1;
  }
  uVar5 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
    }
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&arrays_->elements_[pos0 * 0xf]._M_dataplus._M_p + (ulong)(uVar5 << 5));
  std::__cxx11::string::string(this_00,args);
  pgVar1->m[uVar5].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar5;
  __return_storage_ptr__->p = this_00;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }